

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

filtration_entry_t __thiscall
priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
::pop_pivot(priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
            *this)

{
  pointer pfVar1;
  long lVar2;
  filtration_entry_t fVar3;
  float local_1c;
  
  remove_trivial_coefficient_entries(this);
  pfVar1 = (this->
           super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
           ).c.super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  while (pfVar1 != (this->
                   super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                   ).c.super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish) {
    local_1c = (pfVar1->super_pair<float,_long>).first;
    lVar2 = (pfVar1->super_pair<float,_long>).second;
    safe_pop(this);
    pfVar1 = (this->
             super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
             ).c.super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((pfVar1 == (this->
                   super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                   ).c.super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish) ||
       ((pfVar1->super_pair<float,_long>).second != lVar2)) goto LAB_0012a66a;
    safe_pop(this);
    remove_trivial_coefficient_entries(this);
    pfVar1 = (this->
             super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
             ).c.super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl
             .super__Vector_impl_data._M_start;
  }
  local_1c = 0.0;
  lVar2 = -1;
LAB_0012a66a:
  fVar3.super_pair<float,_long>._4_4_ = 0;
  fVar3.super_pair<float,_long>.first = local_1c;
  fVar3.super_pair<float,_long>.second = lVar2;
  return (filtration_entry_t)fVar3.super_pair<float,_long>;
}

Assistant:

filtration_entry_t pop_pivot() {
		remove_trivial_coefficient_entries();
		if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
			return filtration_entry_t(-1);
		else {
			auto pivot = get_top();
			safe_pop();
			while (!std::priority_queue<filtration_entry_t, Container, Comparator>::empty() &&
			       get_index(std::priority_queue<filtration_entry_t, Container, Comparator>::top()) ==
			           get_index(pivot)) {
				safe_pop();
				remove_trivial_coefficient_entries();

				if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
					return filtration_entry_t(-1);
				else {
					pivot = get_top();
					safe_pop();
				}
			}
			return pivot;
		}
	}